

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printT2AddrModeImm0_1020s4Operand(MCInst *MI,uint OpNum,SStream *O)

{
  cs_struct *h;
  uint uVar1;
  MCOperand *op;
  MCOperand *op_00;
  int64_t iVar2;
  uint tmp;
  MCOperand *MO2;
  MCOperand *MO1;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  SStream_concat0(O,"[");
  set_mem_access(MI,true);
  h = MI->csh;
  uVar1 = MCOperand_getReg(op);
  printRegName(h,O,uVar1);
  if (MI->csh->detail != CS_OPT_OFF) {
    uVar1 = MCOperand_getReg(op);
    *(uint *)(MI->flat_insn->detail->groups +
             (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar1;
  }
  iVar2 = MCOperand_getImm(op_00);
  if (iVar2 != 0) {
    SStream_concat0(O,", ");
    iVar2 = MCOperand_getImm(op_00);
    uVar1 = (int)iVar2 << 2;
    if (uVar1 < 10) {
      SStream_concat(O,"#%u",(ulong)uVar1);
    }
    else {
      SStream_concat(O,"#0x%x",(ulong)uVar1);
    }
    if (MI->csh->detail != CS_OPT_OFF) {
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x52) = uVar1;
    }
  }
  SStream_concat0(O,"]");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printT2AddrModeImm0_1020s4Operand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	unsigned tmp;

	SStream_concat0(O, "[");
	set_mem_access(MI, true);
	printRegName(MI->csh, O, MCOperand_getReg(MO1));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.base = MCOperand_getReg(MO1);
	if (MCOperand_getImm(MO2)) {
		SStream_concat0(O, ", ");
		tmp = (unsigned int)MCOperand_getImm(MO2) * 4;
		if (tmp > HEX_THRESHOLD)
			SStream_concat(O, "#0x%x", tmp);
		else
			SStream_concat(O, "#%u", tmp);
		if (MI->csh->detail)
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].mem.disp = tmp;
	}
	SStream_concat0(O, "]");
	set_mem_access(MI, false);
}